

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qmetatype.h
# Opt level: O2

bool QMetaType::registerMutableViewImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>
               (MutableViewFunction view,QMetaType fromType,QMetaType toType)

{
  char cVar1;
  int iVar2;
  QMetaType in_RDX;
  
  cVar1 = QMetaType::registerMutableViewFunction((function *)fromType.d_ptr,toType,in_RDX);
  if ((cVar1 != '\0') &&
     (registerMutableViewImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
      ::unregister == '\0')) {
    iVar2 = __cxa_guard_acquire(&registerMutableViewImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
                                 ::unregister);
    if (iVar2 != 0) {
      registerMutableViewImpl<QList<QPersistentModelIndex>,_QIterable<QMetaSequence>_>::unregister.
      m_invoke = true;
      registerMutableViewImpl<QList<QPersistentModelIndex>,_QIterable<QMetaSequence>_>::unregister.
      m_func.fromType.d_ptr = toType.d_ptr;
      registerMutableViewImpl<QList<QPersistentModelIndex>,_QIterable<QMetaSequence>_>::unregister.
      m_func.toType.d_ptr = in_RDX.d_ptr;
      __cxa_atexit(QScopeGuard<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/qt[P]qtbase/src/corelib/kernel/qmetatype.h:688:56)>
                   ::~QScopeGuard,
                   &registerMutableViewImpl<QList<QPersistentModelIndex>,_QIterable<QMetaSequence>_>
                    ::unregister,0x7fe000);
      __cxa_guard_release(&registerMutableViewImpl<QList<QPersistentModelIndex>,QIterable<QMetaSequence>>(std::function<bool(void*,void*)>,QMetaType,QMetaType)
                           ::unregister);
    }
  }
  return (bool)cVar1;
}

Assistant:

static bool registerMutableViewImpl(MutableViewFunction view, QMetaType fromType, QMetaType toType)
    {
        if (registerMutableViewFunction(std::move(view), fromType, toType)) {
            static const auto unregister = qScopeGuard([=] {
               unregisterMutableViewFunction(fromType, toType);
            });
            return true;
        } else {
            return false;
        }
    }